

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

void htmlDtdDumpOutput(xmlOutputBufferPtr buf,xmlDocPtr doc,char *encoding)

{
  _xmlDtd *p_Var1;
  int iVar2;
  xmlDtdPtr cur;
  char *encoding_local;
  xmlDocPtr doc_local;
  xmlOutputBufferPtr buf_local;
  
  p_Var1 = doc->intSubset;
  if (p_Var1 == (_xmlDtd *)0x0) {
    htmlSaveErr(0x57a,(xmlNodePtr)doc,(char *)0x0);
  }
  else {
    xmlOutputBufferWriteString(buf,"<!DOCTYPE ");
    xmlOutputBufferWriteString(buf,(char *)p_Var1->name);
    if (p_Var1->ExternalID == (xmlChar *)0x0) {
      if ((p_Var1->SystemID != (xmlChar *)0x0) &&
         (iVar2 = xmlStrcmp(p_Var1->SystemID,(xmlChar *)"about:legacy-compat"), iVar2 != 0)) {
        xmlOutputBufferWriteString(buf," SYSTEM ");
        xmlOutputBufferWriteQuotedString(buf,p_Var1->SystemID);
      }
    }
    else {
      xmlOutputBufferWriteString(buf," PUBLIC ");
      xmlOutputBufferWriteQuotedString(buf,p_Var1->ExternalID);
      if (p_Var1->SystemID != (xmlChar *)0x0) {
        xmlOutputBufferWriteString(buf," ");
        xmlOutputBufferWriteQuotedString(buf,p_Var1->SystemID);
      }
    }
    xmlOutputBufferWriteString(buf,">\n");
  }
  return;
}

Assistant:

static void
htmlDtdDumpOutput(xmlOutputBufferPtr buf, xmlDocPtr doc,
	          const char *encoding ATTRIBUTE_UNUSED) {
    xmlDtdPtr cur = doc->intSubset;

    if (cur == NULL) {
	htmlSaveErr(XML_SAVE_NO_DOCTYPE, (xmlNodePtr) doc, NULL);
	return;
    }
    xmlOutputBufferWriteString(buf, "<!DOCTYPE ");
    xmlOutputBufferWriteString(buf, (const char *)cur->name);
    if (cur->ExternalID != NULL) {
	xmlOutputBufferWriteString(buf, " PUBLIC ");
	xmlOutputBufferWriteQuotedString(buf, cur->ExternalID);
	if (cur->SystemID != NULL) {
	    xmlOutputBufferWriteString(buf, " ");
	    xmlOutputBufferWriteQuotedString(buf, cur->SystemID);
	}
    } else if (cur->SystemID != NULL &&
	       xmlStrcmp(cur->SystemID, BAD_CAST "about:legacy-compat")) {
	xmlOutputBufferWriteString(buf, " SYSTEM ");
	xmlOutputBufferWriteQuotedString(buf, cur->SystemID);
    }
    xmlOutputBufferWriteString(buf, ">\n");
}